

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O2

void __thiscall Transporter::~Transporter(Transporter *this)

{
  this->_vptr_Transporter = (_func_int **)&PTR__Transporter_001944d0;
  free(this->buf);
  (*this->_vptr_Transporter[2])(this);
  if ((this->thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::thread::~thread(&this->thread);
  return;
}

Assistant:

Transporter::~Transporter()
{
	if (buf)
	{
		free(buf);
	}
	Stop();
	if (thread.joinable())
		thread.join();
}